

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O2

void __thiscall QScrollBar::mousePressEvent(QScrollBar *this,QMouseEvent *e)

{
  QBasicTimer *this_00;
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  QScrollBarPrivate *this_01;
  int iVar4;
  SubControl SVar5;
  int iVar6;
  Representation RVar7;
  QStyle *pQVar8;
  QPoint QVar9;
  long lVar10;
  int iVar11;
  undefined8 *puVar12;
  QStyleOptionSlider *pQVar13;
  int iVar14;
  long in_FS_OFFSET;
  byte bVar15;
  undefined1 auVar16 [16];
  QRect local_d8;
  QPointF local_c8;
  QStyleOptionSlider opt;
  
  bVar15 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QScrollBarPrivate **)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  if ((this_01->super_QAbstractSliderPrivate).repeatActionTimer.m_id != Invalid) {
    QScrollBarPrivate::stopRepeatAction(this_01);
  }
  pQVar8 = QWidget::style((QWidget *)this);
  iVar4 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,2,0,this,0);
  puVar12 = &DAT_00661ce0;
  pQVar13 = &opt;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    uVar1 = *puVar12;
    (pQVar13->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar13->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
    pQVar13 = (QStyleOptionSlider *)((long)pQVar13 + (ulong)bVar15 * -0x10 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&opt);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&opt);
  opt.keyboardModifiers.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
  super_QFlagsStorage<Qt::KeyboardModifier>.i =
       *(QFlagsStorageHelper<Qt::KeyboardModifier,_4> *)(e + 0x20);
  if (((this_01->super_QAbstractSliderPrivate).maximum !=
       *(int *)&(this_01->super_QAbstractSliderPrivate).super_QWidgetPrivate.field_0x254) &&
     (uVar2 = *(uint *)(e + 0x40), (*(uint *)(e + 0x44) & ~uVar2) == 0)) {
    if (uVar2 == 1 || iVar4 == 0) {
      if (uVar2 == 1) {
LAB_0043a14f:
        pQVar8 = QWidget::style((QWidget *)this);
        local_c8 = QSinglePointEvent::position((QSinglePointEvent *)e);
        local_d8._0_8_ = QPointF::toPoint(&local_c8);
        SVar5 = (**(code **)(*(long *)pQVar8 + 0xd0))(pQVar8,2,&opt,&local_d8,this);
        this_01->pressedControl = SVar5;
        this_01->pointerOutsidePressedControl = false;
        pQVar8 = QWidget::style((QWidget *)this);
        auVar16 = (**(code **)(*(long *)pQVar8 + 0xd8))(pQVar8,2,&opt,0x40,this);
        local_c8 = QSinglePointEvent::position((QSinglePointEvent *)e);
        QVar9 = QPointF::toPoint(&local_c8);
        iVar14 = auVar16._0_4_;
        iVar11 = auVar16._4_4_;
        if ((this_01->super_QAbstractSliderPrivate).orientation == Horizontal) {
          iVar6 = (int)(((long)auVar16._8_4_ + (long)iVar14) / -2) + iVar14 + QVar9.xp.m_i.m_i;
        }
        else {
          iVar6 = (int)(((auVar16._0_8_ >> 0x20) + (auVar16._8_8_ >> 0x20)) / -2) + iVar11 +
                  QVar9.yp.m_i.m_i;
        }
        iVar6 = QScrollBarPrivate::pixelPosToRangeValue(this_01,iVar6);
        (this_01->super_QAbstractSliderPrivate).pressValue = iVar6;
        SVar5 = this_01->pressedControl;
        if ((SVar5 == SC_ComboBoxArrow) || (SVar5 == SC_ComboBoxListBoxPopup)) {
          if ((iVar4 == 0) || (*(int *)(e + 0x40) != 4)) {
            pQVar8 = QWidget::style((QWidget *)this);
            iVar4 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x27,&opt,this,0);
            if ((iVar4 == 0) || (*(int *)(e + 0x40) != 1)) goto LAB_0043a38f;
          }
          iVar4 = *(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280);
          local_c8 = QSinglePointEvent::position((QSinglePointEvent *)e);
          if (iVar4 == 1) {
            iVar14 = auVar16._8_4_ - iVar14;
            QVar9 = QPointF::toPoint(&local_c8);
            RVar7 = QVar9.xp.m_i;
          }
          else {
            iVar14 = auVar16._12_4_ - iVar11;
            QVar9 = QPointF::toPoint(&local_c8);
            RVar7 = QVar9.yp.m_i;
          }
          iVar4 = (iVar14 + 1) / 2;
          iVar14 = QScrollBarPrivate::pixelPosToRangeValue(this_01,RVar7.m_i - iVar4);
          QAbstractSlider::setSliderPosition(&this->super_QAbstractSlider,iVar14);
          this_01->pressedControl = SC_ScrollBarSlider;
          this_01->clickOffset = iVar4;
        }
        else if (SVar5 == SC_ScrollBarSlider) {
          iVar4 = QVar9.yp.m_i.m_i - iVar11;
          if (*(int *)(*(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8 + 0x280) == 1
             ) {
            iVar4 = QVar9.xp.m_i.m_i - iVar14;
          }
          this_01->clickOffset = iVar4;
          this_01->snapBackPosition = (this_01->super_QAbstractSliderPrivate).position;
        }
LAB_0043a38f:
        local_c8.yp = -0.0;
        local_c8.xp = -0.0;
        QElapsedTimer::start();
        QScrollBarPrivate::activateControl(this_01,this_01->pressedControl,500);
        pQVar8 = QWidget::style((QWidget *)this);
        local_d8 = (QRect)(**(code **)(*(long *)pQVar8 + 0xd8))
                                    (pQVar8,2,&opt,this_01->pressedControl,this);
        QWidget::repaint((QWidget *)this,&local_d8);
        lVar10 = QElapsedTimer::elapsed();
        if ((499 < lVar10) &&
           (this_00 = &(this_01->super_QAbstractSliderPrivate).repeatActionTimer,
           this_00->m_id != Invalid)) {
          QBasicTimer::start(this_00,(Duration)0x2faf080,(QObject *)this);
        }
        if (this_01->pressedControl == SC_ScrollBarSlider) {
          QAbstractSlider::setSliderDown(&this->super_QAbstractSlider,true);
        }
        goto LAB_0043a100;
      }
    }
    else if (uVar2 == 4) goto LAB_0043a14f;
  }
  e[0xc] = (QMouseEvent)0x0;
LAB_0043a100:
  QStyleOption::~QStyleOption((QStyleOption *)&opt);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::mousePressEvent(QMouseEvent *e)
{
    Q_D(QScrollBar);

    if (d->repeatActionTimer.isActive())
        d->stopRepeatAction();

    bool midButtonAbsPos = style()->styleHint(QStyle::SH_ScrollBar_MiddleClickAbsolutePosition,
                                             nullptr, this);
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    opt.keyboardModifiers = e->modifiers();

    if (d->maximum == d->minimum // no range
        || (e->buttons() & (~e->button())) // another button was clicked before
        || !(e->button() == Qt::LeftButton || (midButtonAbsPos && e->button() == Qt::MiddleButton))) {
        e->ignore();
        return;
    }

    d->pressedControl = style()->hitTestComplexControl(QStyle::CC_ScrollBar, &opt, e->position().toPoint(), this);
    d->pointerOutsidePressedControl = false;

    QRect sr = style()->subControlRect(QStyle::CC_ScrollBar, &opt,
                                       QStyle::SC_ScrollBarSlider, this);
    QPoint click = e->position().toPoint();
    QPoint pressValue = click - sr.center() + sr.topLeft();
    d->pressValue = d->orientation == Qt::Horizontal ? d->pixelPosToRangeValue(pressValue.x()) :
        d->pixelPosToRangeValue(pressValue.y());
    if (d->pressedControl == QStyle::SC_ScrollBarSlider) {
        d->clickOffset = HORIZONTAL ? (click.x()-sr.x()) : (click.y()-sr.y());
        d->snapBackPosition = d->position;
    }

    if ((d->pressedControl == QStyle::SC_ScrollBarAddPage
          || d->pressedControl == QStyle::SC_ScrollBarSubPage)
        && ((midButtonAbsPos && e->button() == Qt::MiddleButton)
            || (style()->styleHint(QStyle::SH_ScrollBar_LeftClickAbsolutePosition, &opt, this)
                && e->button() == Qt::LeftButton))) {
        int sliderLength = HORIZONTAL ? sr.width() : sr.height();
        setSliderPosition(d->pixelPosToRangeValue((HORIZONTAL ? e->position().toPoint().x()
                                                              : e->position().toPoint().y()) - sliderLength / 2));
        d->pressedControl = QStyle::SC_ScrollBarSlider;
        d->clickOffset = sliderLength / 2;
    }
    const int initialDelay = 500; // default threshold
    QElapsedTimer time;
    time.start();
    d->activateControl(d->pressedControl, initialDelay);
    repaint(style()->subControlRect(QStyle::CC_ScrollBar, &opt, d->pressedControl, this));
    if (time.elapsed() >= initialDelay && d->repeatActionTimer.isActive()) {
        // It took more than 500ms (the initial timer delay) to process
        // the control activation and repaint(), we therefore need
        // to restart the timer in case we have a pending mouse release event;
        // otherwise we'll get a timer event right before the release event,
        // causing the repeat action to be invoked twice on a single mouse click.
        // 50ms is the default repeat time (see activateControl/setRepeatAction).
        d->repeatActionTimer.start(50, this);
    }
    if (d->pressedControl == QStyle::SC_ScrollBarSlider)
        setSliderDown(true);
}